

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O0

double calc_kurtosis_weighted<double,long,std::vector<double,std::allocator<double>>,double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,long *Xc_ind,
                 long *Xc_indptr,MissingAction missing_action,
                 vector<double,_std::allocator<double>_> *w)

{
  double *pdVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  reference pvVar5;
  double *pdVar6;
  unsigned_long *puVar7;
  long in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  double dVar8;
  long *plVar9;
  double dVar10;
  double dVar11;
  long in_stack_00000008;
  int in_stack_00000010;
  vector<double,_std::allocator<double>_> *in_stack_00000018;
  double out;
  double v;
  double sn;
  size_t *row_2;
  size_t *row_1;
  double xval;
  size_t *ptr_st;
  size_t ind_end_col;
  size_t curr_pos;
  size_t end_col;
  size_t st_col;
  size_t row;
  double cnt;
  double w_this;
  double x_sq;
  double s4;
  double s3;
  double s2;
  double s1;
  double local_e8;
  unsigned_long *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2c;
  undefined1 in_stack_ffffffffffffff2d;
  byte in_stack_ffffffffffffff2e;
  undefined1 in_stack_ffffffffffffff2f;
  undefined1 uVar12;
  unsigned_long *in_stack_ffffffffffffff30;
  ulong *in_stack_ffffffffffffff48;
  ulong *in_stack_ffffffffffffff50;
  double in_stack_ffffffffffffff58;
  unsigned_long *st_00;
  size_t *ix_arr_00;
  double *local_90;
  double *Xc_00;
  MissingAction missing_action_00;
  double local_70;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_8;
  
  if (*(long *)(in_stack_00000008 + in_RCX * 8) == *(long *)(in_stack_00000008 + 8 + in_RCX * 8)) {
    local_8 = -INFINITY;
  }
  else {
    local_40 = 0.0;
    local_48 = 0.0;
    local_50 = 0.0;
    local_58 = 0.0;
    local_70 = 0.0;
    for (; in_RSI <= in_RDX; in_RSI = in_RSI + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_stack_00000018,*(size_type *)(in_RDI + in_RSI * 8));
      local_70 = *pvVar5 + local_70;
    }
    if (0.0 < local_70) {
      local_90 = *(double **)(in_stack_00000008 + in_RCX * 8);
      pdVar1 = *(double **)(in_stack_00000008 + 8 + in_RCX * 8);
      pdVar6 = (double *)((long)pdVar1 + -1);
      ix_arr_00 = *(size_t **)(in_R9 + (long)pdVar6 * 8);
      Xc_00 = local_90;
      puVar7 = std::lower_bound<unsigned_long*,long>
                         (in_stack_ffffffffffffff30,
                          (unsigned_long *)
                          CONCAT17(in_stack_ffffffffffffff2f,
                                   CONCAT16(in_stack_ffffffffffffff2e,
                                            CONCAT15(in_stack_ffffffffffffff2d,
                                                     CONCAT14(in_stack_ffffffffffffff2c,
                                                              in_stack_ffffffffffffff28)))),
                          (long *)in_stack_ffffffffffffff20);
      st_00 = puVar7;
      if (in_stack_00000010 == 0) {
        while( true ) {
          missing_action_00 = (MissingAction)in_RSI;
          uVar12 = false;
          if ((puVar7 != (ulong *)(in_RDI + in_RDX * 8 + 8)) && (uVar12 = false, local_90 != pdVar1)
             ) {
            uVar12 = (size_t *)*puVar7 <= ix_arr_00;
          }
          in_stack_ffffffffffffff48 = puVar7;
          if ((bool)uVar12 == false) break;
          if (*(ulong *)(in_R9 + (long)local_90 * 8) == *puVar7) {
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               (in_stack_00000018,*puVar7);
            dVar10 = *pvVar5;
            in_stack_ffffffffffffff58 = *(double *)(in_R8 + (long)local_90 * 8);
            dVar8 = in_stack_ffffffffffffff58 * in_stack_ffffffffffffff58;
            local_40 = fma(dVar10,in_stack_ffffffffffffff58,local_40);
            local_48 = fma(dVar10,dVar8,local_48);
            local_50 = fma(dVar10,dVar8 * in_stack_ffffffffffffff58,local_50);
            local_58 = fma(dVar10,dVar8 * dVar8,local_58);
            missing_action_00 = (MissingAction)in_RSI;
            in_stack_ffffffffffffff48 = puVar7;
            if ((puVar7 == (ulong *)(in_RDI + in_RDX * 8)) || (local_90 == pdVar6)) break;
            puVar7 = puVar7 + 1;
            plVar9 = std::lower_bound<long*,unsigned_long>
                               ((long *)in_stack_ffffffffffffff30,
                                (long *)CONCAT17(in_stack_ffffffffffffff2f,
                                                 CONCAT16(in_stack_ffffffffffffff2e,
                                                          CONCAT15(uVar12,CONCAT14(
                                                  in_stack_ffffffffffffff2c,
                                                  in_stack_ffffffffffffff28)))),
                                in_stack_ffffffffffffff20);
            local_90 = (double *)((long)plVar9 - in_R9 >> 3);
          }
          else if ((long)*puVar7 < *(long *)(in_R9 + (long)local_90 * 8)) {
            puVar7 = std::lower_bound<unsigned_long*,long>
                               (in_stack_ffffffffffffff30,
                                (unsigned_long *)
                                CONCAT17(in_stack_ffffffffffffff2f,
                                         CONCAT16(in_stack_ffffffffffffff2e,
                                                  CONCAT15(uVar12,CONCAT14(in_stack_ffffffffffffff2c
                                                                           ,
                                                  in_stack_ffffffffffffff28)))),
                                (long *)in_stack_ffffffffffffff20);
          }
          else {
            plVar9 = std::lower_bound<long*,unsigned_long>
                               ((long *)in_stack_ffffffffffffff30,
                                (long *)CONCAT17(in_stack_ffffffffffffff2f,
                                                 CONCAT16(in_stack_ffffffffffffff2e,
                                                          CONCAT15(uVar12,CONCAT14(
                                                  in_stack_ffffffffffffff2c,
                                                  in_stack_ffffffffffffff28)))),
                                in_stack_ffffffffffffff20);
            local_90 = (double *)((long)plVar9 - in_R9 >> 3);
          }
        }
      }
      else {
        while( true ) {
          missing_action_00 = (MissingAction)in_RSI;
          uVar12 = false;
          if ((puVar7 != (ulong *)(in_RDI + in_RDX * 8 + 8)) && (uVar12 = false, local_90 != pdVar1)
             ) {
            uVar12 = (size_t *)*puVar7 <= ix_arr_00;
          }
          if ((bool)uVar12 == false) break;
          if (*(ulong *)(in_R9 + (long)local_90 * 8) == *puVar7) {
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               (in_stack_00000018,*puVar7);
            dVar10 = *pvVar5;
            in_stack_ffffffffffffff58 = *(double *)(in_R8 + (long)local_90 * 8);
            uVar4 = std::isnan(in_stack_ffffffffffffff58);
            in_stack_ffffffffffffff2e = 1;
            if ((uVar4 & 1) == 0) {
              iVar3 = std::isinf(in_stack_ffffffffffffff58);
              in_stack_ffffffffffffff2e = (byte)iVar3;
            }
            if ((in_stack_ffffffffffffff2e & 1) == 0) {
              dVar8 = in_stack_ffffffffffffff58 * in_stack_ffffffffffffff58;
              local_40 = fma(dVar10,in_stack_ffffffffffffff58,local_40);
              local_48 = fma(dVar10,dVar8,local_48);
              local_50 = fma(dVar10,dVar8 * in_stack_ffffffffffffff58,local_50);
              local_58 = fma(dVar10,dVar8 * dVar8,local_58);
            }
            else {
              local_70 = local_70 - dVar10;
            }
            missing_action_00 = (MissingAction)in_RSI;
            if ((puVar7 == (ulong *)(in_RDI + in_RDX * 8)) || (local_90 == pdVar6)) break;
            puVar7 = puVar7 + 1;
            plVar9 = std::lower_bound<long*,unsigned_long>
                               ((long *)in_stack_ffffffffffffff30,
                                (long *)CONCAT17(uVar12,CONCAT16(in_stack_ffffffffffffff2e,
                                                                 CONCAT15(in_stack_ffffffffffffff2d,
                                                                          CONCAT14(
                                                  in_stack_ffffffffffffff2c,
                                                  in_stack_ffffffffffffff28)))),
                                in_stack_ffffffffffffff20);
            local_90 = (double *)((long)plVar9 - in_R9 >> 3);
          }
          else if ((long)*puVar7 < *(long *)(in_R9 + (long)local_90 * 8)) {
            puVar7 = std::lower_bound<unsigned_long*,long>
                               (in_stack_ffffffffffffff30,
                                (unsigned_long *)
                                CONCAT17(uVar12,CONCAT16(in_stack_ffffffffffffff2e,
                                                         CONCAT15(in_stack_ffffffffffffff2d,
                                                                  CONCAT14(in_stack_ffffffffffffff2c
                                                                           ,
                                                  in_stack_ffffffffffffff28)))),
                                (long *)in_stack_ffffffffffffff20);
          }
          else {
            plVar9 = std::lower_bound<long*,unsigned_long>
                               ((long *)in_stack_ffffffffffffff30,
                                (long *)CONCAT17(uVar12,CONCAT16(in_stack_ffffffffffffff2e,
                                                                 CONCAT15(in_stack_ffffffffffffff2d,
                                                                          CONCAT14(
                                                  in_stack_ffffffffffffff2c,
                                                  in_stack_ffffffffffffff28)))),
                                in_stack_ffffffffffffff20);
            local_90 = (double *)((long)plVar9 - in_R9 >> 3);
          }
        }
        in_stack_ffffffffffffff50 = puVar7;
        if (local_70 <= 0.0) {
          return -INFINITY;
        }
      }
      bVar2 = true;
      if (1.0 < local_70) {
        bVar2 = true;
        if ((local_48 != 0.0) || (NAN(local_48))) {
          bVar2 = local_48 == local_40 * local_40;
        }
      }
      if (bVar2) {
        local_8 = -INFINITY;
      }
      else {
        plVar9 = (long *)(local_40 / local_70);
        dVar10 = -(double)plVar9 * (double)plVar9 + local_48 / local_70;
        uVar4 = std::isnan(dVar10);
        if ((uVar4 & 1) == 0) {
          dVar8 = dVar10;
          dVar11 = std::numeric_limits<double>::epsilon();
          if ((dVar11 < dVar8) ||
             (bVar2 = check_more_than_two_unique_values<double,long>
                                (ix_arr_00,(size_t)st_00,(size_t)in_stack_ffffffffffffff58,
                                 (size_t)in_stack_ffffffffffffff50,(long *)in_stack_ffffffffffffff48
                                 ,plVar9,Xc_00,missing_action_00), bVar2)) {
            if (dVar10 <= 0.0) {
              local_8 = 0.0;
            }
            else {
              local_e8 = (local_70 *
                          (double)plVar9 * (double)plVar9 * (double)plVar9 * (double)plVar9 +
                         -(local_40 * 4.0) * (double)plVar9 * (double)plVar9 * (double)plVar9 +
                         local_48 * 6.0 * (double)plVar9 * (double)plVar9 +
                         -(local_50 * 4.0) * (double)plVar9 + local_58) /
                         (local_70 * dVar10 * dVar10);
              uVar4 = std::isnan(local_e8);
              if (((uVar4 & 1) == 0) && (uVar4 = std::isinf(local_e8), (uVar4 & 1) == 0)) {
                if (local_e8 <= 0.0) {
                  local_e8 = 0.0;
                }
              }
              else {
                local_e8 = -INFINITY;
              }
              local_8 = local_e8;
            }
          }
          else {
            local_8 = -INFINITY;
          }
        }
        else {
          local_8 = -INFINITY;
        }
      }
    }
    else {
      local_8 = -INFINITY;
    }
  }
  return local_8;
}

Assistant:

double calc_kurtosis_weighted(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                              real_t Xc[], sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                              MissingAction missing_action, mapping &restrict w)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return -HUGE_VAL;

    ldouble_safe s1 = 0;
    ldouble_safe s2 = 0;
    ldouble_safe s3 = 0;
    ldouble_safe s4 = 0;
    ldouble_safe x_sq;
    ldouble_safe w_this;
    ldouble_safe cnt = 0;
    for (size_t row = st; row <= end; row++)
        cnt += w[ix_arr[row]];

    if (unlikely(cnt <= 0)) return -HUGE_VAL;
    
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);

    ldouble_safe xval;

    if (missing_action != Fail)
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                w_this = w[*row];
                xval = Xc[curr_pos];

                if (unlikely(is_na_or_inf(xval)))
                {
                    cnt -= w_this;
                }

                else
                {
                    x_sq = xval * xval;
                    s1 = std::fma(w_this, xval, s1);
                    s2 = std::fma(w_this, x_sq, s2);
                    s3 = std::fma(w_this, x_sq*xval, s3);
                    s4 = std::fma(w_this, x_sq*x_sq, s4);
                    // s1 += w_this * pw1(xval);
                    // s2 += w_this * pw2(xval);
                    // s3 += w_this * pw3(xval);
                    // s4 += w_this * pw4(xval);
                }

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }

        if (unlikely(cnt <= 0)) return -HUGE_VAL;
    }

    else
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                w_this = w[*row];
                xval = Xc[curr_pos];
                
                x_sq = xval * xval;
                s1 = std::fma(w_this, xval, s1);
                s2 = std::fma(w_this, x_sq, s2);
                s3 = std::fma(w_this, x_sq*xval, s3);
                s4 = std::fma(w_this, x_sq*x_sq, s4);
                // s1 += w_this * pw1(xval);
                // s2 += w_this * pw2(xval);
                // s3 += w_this * pw3(xval);
                // s4 += w_this * pw4(xval);

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }
    }

    if (unlikely(cnt <= 1 || s2 == 0 || s2 == pw2(s1))) return -HUGE_VAL;
    ldouble_safe sn = s1 / cnt;
    ldouble_safe v  = s2 / cnt - pw2(sn);
    if (unlikely(std::isnan(v))) return -HUGE_VAL;
    if (
        v <= std::numeric_limits<double>::epsilon() &&
        !check_more_than_two_unique_values(ix_arr, st, end, col_num,
                                           Xc_indptr, Xc_ind, Xc,
                                           missing_action)
    )
        return -HUGE_VAL;
    if (v <= 0) return 0.;
    ldouble_safe out =  (s4 - 4 * s3 * sn + 6 * s2 * pw2(sn) - 4 * s1 * pw3(sn) + cnt * pw4(sn)) / (cnt * pw2(v));
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}